

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

char * seekNewline(char *s,size_t len)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = (int)len + -1;
  iVar2 = 0;
  while( true ) {
    if (iVar1 <= iVar2) {
      return (char *)0x0;
    }
    lVar3 = (long)iVar2;
    lVar4 = lVar3 << 0x20;
    lVar5 = 0;
    while (s[lVar5 + lVar3] != '\r') {
      lVar4 = lVar4 + 0x100000000;
      lVar5 = lVar5 + 1;
      if (iVar1 - lVar3 == lVar5) {
        return (char *)0x0;
      }
    }
    if (iVar1 - iVar2 == (int)lVar5) break;
    iVar2 = iVar2 + (int)lVar5 + 1;
    if (s[iVar2] == '\n') {
      return s + (lVar4 >> 0x20);
    }
  }
  return (char *)0x0;
}

Assistant:

static char *seekNewline(char *s, size_t len) {
    int pos = 0;
    int _len = len-1;

    /* Position should be < len-1 because the character at "pos" should be
     * followed by a \n. Note that strchr cannot be used because it doesn't
     * allow to search a limited length and the buffer that is being searched
     * might not have a trailing NULL character. */
    while (pos < _len) {
        while(pos < _len && s[pos] != '\r') pos++;
        if (pos==_len) {
            /* Not found. */
            return NULL;
        } else {
            if (s[pos+1] == '\n') {
                /* Found. */
                return s+pos;
            } else {
                /* Continue searching. */
                pos++;
            }
        }
    }
    return NULL;
}